

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

void tty_open(void)

{
  int iVar1;
  termios local_44;
  
  if (TTY_Fd < 0) {
    TTY_Fd = open(TTY_Dev,2);
    if (TTY_Fd < 0) {
      error("TTY: tty_open");
      return;
    }
    tcgetattr(TTY_Fd,&local_44);
    local_44.c_iflag = (local_44.c_iflag & 0xffffca00) + 1;
    local_44.c_oflag._0_1_ = (byte)local_44.c_oflag & 0xfe;
    local_44.c_lflag = local_44.c_lflag & 0xffff7e04;
    local_44.c_cflag = local_44.c_cflag & 0xfffffe4f | 0xb0;
    local_44.c_cc[5] = '\0';
    local_44.c_cc[6] = '\x01';
    tcsetattr(TTY_Fd,0,&local_44);
    iVar1 = TTY_Fd + 0x3f;
    if (-1 < TTY_Fd) {
      iVar1 = TTY_Fd;
    }
    LispReadFds.__fds_bits[iVar1 >> 6] =
         LispReadFds.__fds_bits[iVar1 >> 6] | 1L << ((byte)TTY_Fd & 0x3f);
  }
  return;
}

Assistant:

void tty_open(void)
{
  struct termios options;

  if (TTY_Fd < 0) {
    if ((TTY_Fd = open(TTY_Dev, O_RDWR)) >= 0) {
      tcgetattr(TTY_Fd, &options);
#ifndef MAIKO_OS_HAIKU
      options.c_iflag &= ~(IMAXBEL|IXOFF|INPCK|BRKINT|PARMRK|ISTRIP|INLCR|IGNCR|ICRNL|IXON|IGNPAR);
#else
      options.c_iflag &= ~(IXOFF|INPCK|BRKINT|PARMRK|ISTRIP|INLCR|IGNCR|ICRNL|IXON|IGNPAR);
#endif
      options.c_iflag |= IGNBRK;
      options.c_oflag &= ~OPOST;
      options.c_lflag &= ~(ECHO|ECHOE|ECHOK|ECHONL|ICANON|ISIG|IEXTEN|NOFLSH|TOSTOP);
      options.c_cflag &= ~(CSIZE|PARENB);
      options.c_cflag |= CS8|CREAD;
      options.c_cc[VMIN] = 1;
      options.c_cc[VTIME] = 0;
      tcsetattr(TTY_Fd, TCSANOW, &options);

      FD_SET(TTY_Fd, &LispReadFds);
#ifdef TTYINT
      int_io_open(TTY_Fd);
#endif

    } else {
      error("TTY: tty_open");
    }
  }
}